

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::initPh2RowBound(HModel *this,int firstrow,int lastrow)

{
  value_type vVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  reference pvVar5;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int var;
  int row;
  undefined4 local_14;
  
  for (local_14 = in_ESI; local_14 <= in_EDX; local_14 = local_14 + 1) {
    iVar4 = *(int *)(in_RDI + 0x60c) + local_14;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x708),(long)local_14);
    vVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7e0),(long)iVar4);
    *pvVar5 = -vVar1;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6f0),(long)local_14);
    vVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7f8),(long)iVar4);
    *pvVar5 = -vVar1;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7f8),(long)iVar4);
    dVar2 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7e0),(long)iVar4);
    dVar3 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x810),(long)iVar4);
    *pvVar5 = dVar2 - dVar3;
  }
  return;
}

Assistant:

void HModel::initPh2RowBound(int firstrow, int lastrow) {
  // Copy bounds and compute ranges
  assert(firstrow >= 0);
  assert(lastrow < numRow);
  for (int row = firstrow; row <= lastrow; row++) {
    int var = numCol+row;
    workLower[var] = -rowUpper[row];
    workUpper[var] = -rowLower[row];
    workRange[var] = workUpper[var] - workLower[var];
  }
}